

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O3

xml_parse_result * __thiscall
NULLCPugiXML::xml_document__load_file
          (NULLCPugiXML *this,NULLCArray name,uint options,xml_encoding encoding,
          xml_document *document)

{
  long *plVar1;
  xml_document *this_00;
  xml_parse_result *pxVar2;
  undefined4 in_register_00000084;
  xml_parse_result local_48;
  
  plVar1 = *(long **)CONCAT44(in_register_00000084,encoding);
  if (plVar1 == (long *)0x0) {
    pxVar2 = (xml_parse_result *)0x0;
    nullcThrowError("xml_document constructor wasn\'t called",name.ptr);
  }
  else {
    this_00 = (xml_document *)*plVar1;
    if (this_00 == (xml_document *)0x0) {
      this_00 = (xml_document *)nullcAllocate(0xd0);
      **(undefined8 **)CONCAT44(in_register_00000084,encoding) = this_00;
      pugi::xml_document::xml_document(this_00);
    }
    pxVar2 = (xml_parse_result *)nullcAllocate(0xc);
    pugi::xml_document::load_file(&local_48,this_00,(char *)this,name.len,options);
    pxVar2->status = local_48.status;
    pxVar2->offset = (int)local_48.offset;
    pxVar2->encoding = local_48.encoding;
  }
  return pxVar2;
}

Assistant:

xml_parse_result* xml_document__load_file(NULLCArray name, unsigned int options, pugi::xml_encoding encoding, xml_document* document)
	{
		if(!document->impl){ nullcThrowError("xml_document constructor wasn't called"); return NULL; }
		pugi::xml_document *doc = document->impl->document;
		if(!doc)
		{
			doc = document->impl->document = (pugi::xml_document*)nullcAllocate(sizeof(pugi::xml_document));
			::new(doc) pugi::xml_document();
		}
		xml_parse_result *res = (xml_parse_result*)nullcAllocate(sizeof(xml_parse_result));
		*res = doc->load_file(name.ptr, options, encoding);
		return res;
	}